

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
int_writer<int,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  
  pcVar1 = format_decimal<char,unsigned_int,char*,duckdb_fmt::v6::internal::format_decimal<char,char*,unsigned_int>(char*,unsigned_int,int)::_lambda(char*)_1_>
                     (*it,*(undefined4 *)this,*(undefined4 *)(this + 4));
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }